

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::
     log<char_const(&)[59],kj::_::DebugComparison<char_const(&)[4],std::__cxx11::string>&,char_const(&)[4],std::__cxx11::string>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [59],
               DebugComparison<const_char_(&)[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *params_1,char (*params_2) [4],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3)

{
  pointer __src;
  size_t size;
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  char (*params_00) [4];
  long lVar4;
  String *result;
  String argValues [4];
  undefined4 in_stack_ffffffffffffff38;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  String local_98;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  String local_68;
  String local_50;
  
  str<char_const(&)[59]>
            (&local_98,(kj *)params,(char (*) [59])CONCAT44(in_register_00000014,severity));
  _::operator*(&local_b8,params_1);
  local_80 = local_b8;
  local_78 = local_b0;
  uStack_70 = uStack_a8;
  str<char_const(&)[4]>(&local_68,(kj *)params_2,params_00);
  __src = (params_3->_M_dataplus)._M_p;
  size = params_3->_M_string_length;
  heapString(&local_50,size);
  if (size != 0) {
    if ((char *)local_50.content.size_ != (char *)0x0) {
      local_50.content.size_ = (size_t)local_50.content.ptr;
    }
    memcpy((void *)local_50.content.size_,__src,size);
  }
  argValues_00.ptr._4_4_ = severity;
  argValues_00.ptr._0_4_ = in_stack_ffffffffffffff38;
  argValues_00.size_ = (size_t)macroArgs;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)&local_98,argValues_00);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)&local_98.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_98.content.size_ + lVar4);
      *(undefined8 *)((long)&local_98.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_98.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_98.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}